

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O2

Vec_Int_t * Abc_NtkMapGiaIntoNameId(Abc_Ntk_t *pNetlist,Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  long *plVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  p = (Vec_Int_t *)calloc(1,0x10);
  if (pGia == (Gia_Man_t *)0x0) {
    piVar4 = &pAig->vObjs->nSize;
  }
  else {
    piVar4 = &pGia->nObjs;
  }
  uVar1 = *piVar4;
  uVar8 = 0;
  if ((long)(int)uVar1 < 1) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    p->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = uVar1;
  }
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    piVar4[uVar8] = -1;
  }
  p->nSize = uVar1;
  for (iVar7 = 0; iVar7 < pNetlist->vObjs->nSize; iVar7 = iVar7 + 1) {
    plVar5 = (long *)Vec_PtrEntry(pNetlist->vObjs,iVar7);
    if (((plVar5 != (long *)0x0) && ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 6)) &&
       ((lVar2 = *(long *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                    (long)*(int *)plVar5[4] * 8) + 0x40), lVar2 != 0 &&
        (((uVar8 = *(ulong *)(lVar2 + 0x40) & 0xfffffffffffffffe, uVar8 != 0 &&
          (uVar8 = *(ulong *)(uVar8 + 0x40) & 0xfffffffffffffffe, uVar8 != 0)) &&
         ((*(byte *)(uVar8 + 0x18) & 7) != 0)))))) {
      if (pGia == (Gia_Man_t *)0x0) {
        iVar3 = *(int *)(uVar8 + 0x24);
      }
      else {
        iVar3 = Abc_Lit2Var(*(int *)(uVar8 + 0x28));
      }
      Vec_IntWriteEntry(p,iVar3,(int)plVar5[2]);
    }
  }
  for (iVar7 = 0; iVar7 < pNetlist->vCos->nSize; iVar7 = iVar7 + 1) {
    plVar5 = (long *)Vec_PtrEntry(pNetlist->vCos,iVar7);
    if (((plVar5[8] != 0) && (uVar8 = *(ulong *)(plVar5[8] + 0x40) & 0xfffffffffffffffe, uVar8 != 0)
        ) && ((uVar8 = *(ulong *)(uVar8 + 0x40) & 0xfffffffffffffffe, uVar8 != 0 &&
              ((*(byte *)(uVar8 + 0x18) & 7) != 0)))) {
      lVar2 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8);
      if (pGia == (Gia_Man_t *)0x0) {
        iVar3 = *(int *)(uVar8 + 0x24);
      }
      else {
        iVar3 = Abc_Lit2Var(*(int *)(uVar8 + 0x28));
      }
      Vec_IntWriteEntry(p,iVar3,*(int *)(lVar2 + 0x10));
    }
  }
  for (iVar7 = 0; iVar7 < pNetlist->vCis->nSize; iVar7 = iVar7 + 1) {
    plVar5 = (long *)Vec_PtrEntry(pNetlist->vCis,iVar7);
    if ((((plVar5[8] != 0) &&
         (uVar8 = *(ulong *)(plVar5[8] + 0x40) & 0xfffffffffffffffe, uVar8 != 0)) &&
        (uVar8 = *(ulong *)(uVar8 + 0x40) & 0xfffffffffffffffe, uVar8 != 0)) &&
       ((*(byte *)(uVar8 + 0x18) & 7) != 0)) {
      lVar2 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8);
      if (pGia == (Gia_Man_t *)0x0) {
        iVar3 = *(int *)(uVar8 + 0x24);
      }
      else {
        iVar3 = Abc_Lit2Var(*(int *)(uVar8 + 0x28));
      }
      Vec_IntWriteEntry(p,iVar3,*(int *)(lVar2 + 0x10));
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkMapGiaIntoNameId( Abc_Ntk_t * pNetlist, Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Vec_Int_t * vId2Name;
    Abc_Obj_t * pNet, * pNode, * pAnd;
    Aig_Obj_t * pObjAig;
    int i;
    vId2Name = Vec_IntAlloc( 0 );
    Vec_IntFill( vId2Name, pGia ? Gia_ManObjNum(pGia) : Aig_ManObjNumMax(pAig), ~0 );
    // copy all names
    Abc_NtkForEachNet( pNetlist, pNet, i )
    {
        pNode = Abc_ObjFanin0(pNet)->pCopy; 
        if ( pNode && (pAnd = Abc_ObjRegular(pNode->pCopy)) && 
            (pObjAig = (Aig_Obj_t *)Abc_ObjRegular(pAnd->pCopy)) && 
             Aig_ObjType(pObjAig) != AIG_OBJ_NONE )
        {
            if ( pGia == NULL )
                Vec_IntWriteEntry( vId2Name, Aig_ObjId(pObjAig), Abc_ObjId(pNet) );
            else
                Vec_IntWriteEntry( vId2Name, Abc_Lit2Var(pObjAig->iData), Abc_ObjId(pNet) );
        }
    }
    // overwrite CO names
    Abc_NtkForEachCo( pNetlist, pNode, i )
    {
        pNet = Abc_ObjFanin0(pNode);
        pNode = pNode->pCopy;
        if ( pNode && (pAnd = Abc_ObjRegular(pNode->pCopy)) && 
            (pObjAig = (Aig_Obj_t *)Abc_ObjRegular(pAnd->pCopy)) && 
             Aig_ObjType(pObjAig) != AIG_OBJ_NONE )
        {
            if ( pGia == NULL )
                Vec_IntWriteEntry( vId2Name, Aig_ObjId(pObjAig), Abc_ObjId(pNet) );
            else
                Vec_IntWriteEntry( vId2Name, Abc_Lit2Var(pObjAig->iData), Abc_ObjId(pNet) );
        }
    }
    // overwrite CI names
    Abc_NtkForEachCi( pNetlist, pNode, i )
    {
        pNet = Abc_ObjFanout0(pNode);
        pNode = pNode->pCopy;
        if ( pNode && (pAnd = Abc_ObjRegular(pNode->pCopy)) && 
            (pObjAig = (Aig_Obj_t *)Abc_ObjRegular(pAnd->pCopy)) && 
             Aig_ObjType(pObjAig) != AIG_OBJ_NONE )
        {
            if ( pGia == NULL )
                Vec_IntWriteEntry( vId2Name, Aig_ObjId(pObjAig), Abc_ObjId(pNet) );
            else
                Vec_IntWriteEntry( vId2Name, Abc_Lit2Var(pObjAig->iData), Abc_ObjId(pNet) );
        }
    }
    return vId2Name;
}